

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu.cpp
# Opt level: O2

int __thiscall ncnn::ReLU::forward_inplace(ReLU *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  int i;
  ulong uVar9;
  int i_1;
  
  uVar3 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
  lVar5 = bottom_top_blob->elemsize * bottom_top_blob->cstep;
  uVar6 = 0;
  uVar4 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar4 = uVar6;
  }
  pvVar7 = bottom_top_blob->data;
  if (0 < bottom_top_blob->c) {
    uVar6 = (ulong)(uint)bottom_top_blob->c;
  }
  if (this->slope == 0.0) {
    for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
      for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
        pfVar1 = (float *)((long)pvVar7 + uVar9 * 4);
        if (*pfVar1 <= 0.0 && *pfVar1 != 0.0) {
          *(undefined4 *)((long)pvVar7 + uVar9 * 4) = 0;
        }
      }
      pvVar7 = (void *)((long)pvVar7 + lVar5);
    }
  }
  else {
    for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
      for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
        fVar2 = *(float *)((long)pvVar7 + uVar9 * 4);
        if (fVar2 < 0.0) {
          *(float *)((long)pvVar7 + uVar9 * 4) = fVar2 * this->slope;
        }
      }
      pvVar7 = (void *)((long)pvVar7 + lVar5);
    }
  }
  return 0;
}

Assistant:

int ReLU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] = 0;
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    return 0;
}